

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RS_Driver::Update(RS_Driver *this,double time)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ifstream *piVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  byte bVar34;
  int i_1;
  Actuation *pAVar35;
  ostream *poVar36;
  int i;
  long lVar37;
  Phase PVar38;
  long lVar39;
  undefined8 uVar40;
  PhaseChangeCallback *pPVar41;
  double dVar42;
  double dVar43;
  undefined8 in_XMM0_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  string local_50;
  double local_30;
  
  PVar38 = this->m_phase;
  if (PVar38 == HOLD) {
    dVar42 = (this->m_actuations_1)._M_elems[0]._M_elems[0];
    dVar43 = (this->m_actuations_1)._M_elems[0]._M_elems[1];
    dVar2 = (this->m_actuations_1)._M_elems[0]._M_elems[2];
    dVar5 = (this->m_actuations_1)._M_elems[0]._M_elems[3];
    dVar6 = (this->m_actuations_1)._M_elems[0]._M_elems[4];
    dVar7 = (this->m_actuations_1)._M_elems[0]._M_elems[5];
    dVar8 = (this->m_actuations_1)._M_elems[0]._M_elems[6];
    dVar9 = (this->m_actuations_1)._M_elems[0]._M_elems[7];
    dVar10 = (this->m_actuations_1)._M_elems[1]._M_elems[0];
    dVar11 = (this->m_actuations_1)._M_elems[1]._M_elems[1];
    dVar12 = (this->m_actuations_1)._M_elems[1]._M_elems[2];
    dVar13 = (this->m_actuations_1)._M_elems[1]._M_elems[3];
    dVar14 = (this->m_actuations_1)._M_elems[1]._M_elems[4];
    dVar15 = (this->m_actuations_1)._M_elems[1]._M_elems[5];
    dVar16 = (this->m_actuations_1)._M_elems[1]._M_elems[6];
    dVar17 = (this->m_actuations_1)._M_elems[1]._M_elems[7];
    dVar18 = (this->m_actuations_1)._M_elems[2]._M_elems[0];
    dVar19 = (this->m_actuations_1)._M_elems[2]._M_elems[1];
    dVar20 = (this->m_actuations_1)._M_elems[2]._M_elems[2];
    dVar21 = (this->m_actuations_1)._M_elems[2]._M_elems[3];
    dVar22 = (this->m_actuations_1)._M_elems[2]._M_elems[4];
    dVar23 = (this->m_actuations_1)._M_elems[2]._M_elems[5];
    dVar24 = (this->m_actuations_1)._M_elems[2]._M_elems[6];
    dVar25 = (this->m_actuations_1)._M_elems[2]._M_elems[7];
    dVar26 = (this->m_actuations_1)._M_elems[3]._M_elems[1];
    dVar27 = (this->m_actuations_1)._M_elems[3]._M_elems[2];
    dVar28 = (this->m_actuations_1)._M_elems[3]._M_elems[3];
    dVar29 = (this->m_actuations_1)._M_elems[3]._M_elems[4];
    dVar30 = (this->m_actuations_1)._M_elems[3]._M_elems[5];
    dVar31 = (this->m_actuations_1)._M_elems[3]._M_elems[6];
    dVar32 = (this->m_actuations_1)._M_elems[3]._M_elems[7];
    (this->m_actuations)._M_elems[3]._M_elems[0] = (this->m_actuations_1)._M_elems[3]._M_elems[0];
    (this->m_actuations)._M_elems[3]._M_elems[1] = dVar26;
    (this->m_actuations)._M_elems[3]._M_elems[2] = dVar27;
    (this->m_actuations)._M_elems[3]._M_elems[3] = dVar28;
    (this->m_actuations)._M_elems[3]._M_elems[4] = dVar29;
    (this->m_actuations)._M_elems[3]._M_elems[5] = dVar30;
    (this->m_actuations)._M_elems[3]._M_elems[6] = dVar31;
    (this->m_actuations)._M_elems[3]._M_elems[7] = dVar32;
    (this->m_actuations)._M_elems[2]._M_elems[0] = dVar18;
    (this->m_actuations)._M_elems[2]._M_elems[1] = dVar19;
    (this->m_actuations)._M_elems[2]._M_elems[2] = dVar20;
    (this->m_actuations)._M_elems[2]._M_elems[3] = dVar21;
    (this->m_actuations)._M_elems[2]._M_elems[4] = dVar22;
    (this->m_actuations)._M_elems[2]._M_elems[5] = dVar23;
    (this->m_actuations)._M_elems[2]._M_elems[6] = dVar24;
    (this->m_actuations)._M_elems[2]._M_elems[7] = dVar25;
    (this->m_actuations)._M_elems[1]._M_elems[0] = dVar10;
    (this->m_actuations)._M_elems[1]._M_elems[1] = dVar11;
    (this->m_actuations)._M_elems[1]._M_elems[2] = dVar12;
    (this->m_actuations)._M_elems[1]._M_elems[3] = dVar13;
    (this->m_actuations)._M_elems[1]._M_elems[4] = dVar14;
    (this->m_actuations)._M_elems[1]._M_elems[5] = dVar15;
    (this->m_actuations)._M_elems[1]._M_elems[6] = dVar16;
    (this->m_actuations)._M_elems[1]._M_elems[7] = dVar17;
    (this->m_actuations)._M_elems[0]._M_elems[0] = dVar42;
    (this->m_actuations)._M_elems[0]._M_elems[1] = dVar43;
    (this->m_actuations)._M_elems[0]._M_elems[2] = dVar2;
    (this->m_actuations)._M_elems[0]._M_elems[3] = dVar5;
    (this->m_actuations)._M_elems[0]._M_elems[4] = dVar6;
    (this->m_actuations)._M_elems[0]._M_elems[5] = dVar7;
    (this->m_actuations)._M_elems[0]._M_elems[6] = dVar8;
    (this->m_actuations)._M_elems[0]._M_elems[7] = dVar9;
    if (time < this->m_offset) {
      return;
    }
    bVar34 = std::__basic_file<char>::is_open();
    this->m_phase = bVar34 ^ CYCLE;
    std::operator<<((ostream *)&std::cout,"time = ");
    poVar36 = std::ostream::_M_insert<double>(time);
    poVar36 = std::operator<<(poVar36,"  Switch to phase: ");
    GetCurrentPhase_abi_cxx11_(&local_50,this);
    poVar36 = std::operator<<(poVar36,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar36);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar41 = this->m_callback;
    if (pPVar41 == (PhaseChangeCallback *)0x0) {
      return;
    }
    PVar38 = this->m_phase;
    lVar37 = *(long *)pPVar41;
    uVar40 = 1;
  }
  else {
    if (PVar38 != POSE) {
      dVar42 = time - this->m_offset;
      if (PVar38 == START) {
        pdVar1 = &this->m_time_2;
        pAVar35 = &this->m_actuations_2;
        while (dVar43 = *pdVar1, dVar43 < dVar42) {
          this->m_time_1 = dVar43;
          dVar43 = pAVar35->_M_elems[0]._M_elems[0];
          dVar2 = (this->m_actuations_2)._M_elems[0]._M_elems[1];
          dVar5 = (this->m_actuations_2)._M_elems[0]._M_elems[2];
          dVar6 = (this->m_actuations_2)._M_elems[0]._M_elems[3];
          dVar7 = (this->m_actuations_2)._M_elems[0]._M_elems[4];
          dVar8 = (this->m_actuations_2)._M_elems[0]._M_elems[5];
          dVar9 = (this->m_actuations_2)._M_elems[0]._M_elems[6];
          dVar10 = (this->m_actuations_2)._M_elems[0]._M_elems[7];
          dVar11 = (this->m_actuations_2)._M_elems[1]._M_elems[0];
          dVar12 = (this->m_actuations_2)._M_elems[1]._M_elems[1];
          dVar13 = (this->m_actuations_2)._M_elems[1]._M_elems[2];
          dVar14 = (this->m_actuations_2)._M_elems[1]._M_elems[3];
          dVar15 = (this->m_actuations_2)._M_elems[1]._M_elems[4];
          dVar16 = (this->m_actuations_2)._M_elems[1]._M_elems[5];
          dVar17 = (this->m_actuations_2)._M_elems[1]._M_elems[6];
          dVar18 = (this->m_actuations_2)._M_elems[1]._M_elems[7];
          dVar19 = (this->m_actuations_2)._M_elems[2]._M_elems[0];
          dVar20 = (this->m_actuations_2)._M_elems[2]._M_elems[1];
          dVar21 = (this->m_actuations_2)._M_elems[2]._M_elems[2];
          dVar22 = (this->m_actuations_2)._M_elems[2]._M_elems[3];
          dVar23 = (this->m_actuations_2)._M_elems[2]._M_elems[4];
          dVar24 = (this->m_actuations_2)._M_elems[2]._M_elems[5];
          dVar25 = (this->m_actuations_2)._M_elems[2]._M_elems[6];
          dVar26 = (this->m_actuations_2)._M_elems[2]._M_elems[7];
          dVar27 = (this->m_actuations_2)._M_elems[3]._M_elems[1];
          dVar28 = (this->m_actuations_2)._M_elems[3]._M_elems[2];
          dVar29 = (this->m_actuations_2)._M_elems[3]._M_elems[3];
          dVar30 = (this->m_actuations_2)._M_elems[3]._M_elems[4];
          dVar31 = (this->m_actuations_2)._M_elems[3]._M_elems[5];
          dVar32 = (this->m_actuations_2)._M_elems[3]._M_elems[6];
          dVar33 = (this->m_actuations_2)._M_elems[3]._M_elems[7];
          (this->m_actuations_1)._M_elems[3]._M_elems[0] =
               (this->m_actuations_2)._M_elems[3]._M_elems[0];
          (this->m_actuations_1)._M_elems[3]._M_elems[1] = dVar27;
          (this->m_actuations_1)._M_elems[3]._M_elems[2] = dVar28;
          (this->m_actuations_1)._M_elems[3]._M_elems[3] = dVar29;
          (this->m_actuations_1)._M_elems[3]._M_elems[4] = dVar30;
          (this->m_actuations_1)._M_elems[3]._M_elems[5] = dVar31;
          (this->m_actuations_1)._M_elems[3]._M_elems[6] = dVar32;
          (this->m_actuations_1)._M_elems[3]._M_elems[7] = dVar33;
          (this->m_actuations_1)._M_elems[2]._M_elems[0] = dVar19;
          (this->m_actuations_1)._M_elems[2]._M_elems[1] = dVar20;
          (this->m_actuations_1)._M_elems[2]._M_elems[2] = dVar21;
          (this->m_actuations_1)._M_elems[2]._M_elems[3] = dVar22;
          (this->m_actuations_1)._M_elems[2]._M_elems[4] = dVar23;
          (this->m_actuations_1)._M_elems[2]._M_elems[5] = dVar24;
          (this->m_actuations_1)._M_elems[2]._M_elems[6] = dVar25;
          (this->m_actuations_1)._M_elems[2]._M_elems[7] = dVar26;
          (this->m_actuations_1)._M_elems[1]._M_elems[0] = dVar11;
          (this->m_actuations_1)._M_elems[1]._M_elems[1] = dVar12;
          (this->m_actuations_1)._M_elems[1]._M_elems[2] = dVar13;
          (this->m_actuations_1)._M_elems[1]._M_elems[3] = dVar14;
          (this->m_actuations_1)._M_elems[1]._M_elems[4] = dVar15;
          (this->m_actuations_1)._M_elems[1]._M_elems[5] = dVar16;
          (this->m_actuations_1)._M_elems[1]._M_elems[6] = dVar17;
          (this->m_actuations_1)._M_elems[1]._M_elems[7] = dVar18;
          (this->m_actuations_1)._M_elems[0]._M_elems[0] = dVar43;
          (this->m_actuations_1)._M_elems[0]._M_elems[1] = dVar2;
          (this->m_actuations_1)._M_elems[0]._M_elems[2] = dVar5;
          (this->m_actuations_1)._M_elems[0]._M_elems[3] = dVar6;
          (this->m_actuations_1)._M_elems[0]._M_elems[4] = dVar7;
          (this->m_actuations_1)._M_elems[0]._M_elems[5] = dVar8;
          (this->m_actuations_1)._M_elems[0]._M_elems[6] = dVar9;
          (this->m_actuations_1)._M_elems[0]._M_elems[7] = dVar10;
          if (((byte)this->m_ifs[*(long *)(*(long *)this->m_ifs + -0x18) + 0x20] & 2) != 0) {
            this->m_phase = CYCLE;
            this->m_ifs = &this->m_ifs_cycle;
            LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
            LoadDataLine(this,pdVar1,pAVar35);
            this->m_offset = time;
            std::operator<<((ostream *)&std::cout,"time = ");
            poVar36 = std::ostream::_M_insert<double>(time);
            poVar36 = std::operator<<(poVar36,"  Switch to phase: ");
            GetCurrentPhase_abi_cxx11_(&local_50,this);
            poVar36 = std::operator<<(poVar36,(string *)&local_50);
            std::endl<char,std::char_traits<char>>(poVar36);
            std::__cxx11::string::~string((string *)&local_50);
            pPVar41 = this->m_callback;
            if (pPVar41 == (PhaseChangeCallback *)0x0) {
              return;
            }
            lVar37 = *(long *)pPVar41;
            uVar40 = 2;
            PVar38 = CYCLE;
            goto LAB_0016226c;
          }
          LoadDataLine(this,pdVar1,pAVar35);
        }
      }
      else if (PVar38 == CYCLE) {
        if (this->driven != false) {
          return;
        }
        pdVar1 = &this->m_time_2;
        pAVar35 = &this->m_actuations_2;
        while (dVar43 = *pdVar1, dVar43 < dVar42) {
          this->m_time_1 = dVar43;
          dVar43 = pAVar35->_M_elems[0]._M_elems[0];
          dVar2 = (this->m_actuations_2)._M_elems[0]._M_elems[1];
          dVar5 = (this->m_actuations_2)._M_elems[0]._M_elems[2];
          dVar6 = (this->m_actuations_2)._M_elems[0]._M_elems[3];
          dVar7 = (this->m_actuations_2)._M_elems[0]._M_elems[4];
          dVar8 = (this->m_actuations_2)._M_elems[0]._M_elems[5];
          dVar9 = (this->m_actuations_2)._M_elems[0]._M_elems[6];
          dVar10 = (this->m_actuations_2)._M_elems[0]._M_elems[7];
          dVar11 = (this->m_actuations_2)._M_elems[1]._M_elems[0];
          dVar12 = (this->m_actuations_2)._M_elems[1]._M_elems[1];
          dVar13 = (this->m_actuations_2)._M_elems[1]._M_elems[2];
          dVar14 = (this->m_actuations_2)._M_elems[1]._M_elems[3];
          dVar15 = (this->m_actuations_2)._M_elems[1]._M_elems[4];
          dVar16 = (this->m_actuations_2)._M_elems[1]._M_elems[5];
          dVar17 = (this->m_actuations_2)._M_elems[1]._M_elems[6];
          dVar18 = (this->m_actuations_2)._M_elems[1]._M_elems[7];
          dVar19 = (this->m_actuations_2)._M_elems[2]._M_elems[0];
          dVar20 = (this->m_actuations_2)._M_elems[2]._M_elems[1];
          dVar21 = (this->m_actuations_2)._M_elems[2]._M_elems[2];
          dVar22 = (this->m_actuations_2)._M_elems[2]._M_elems[3];
          dVar23 = (this->m_actuations_2)._M_elems[2]._M_elems[4];
          dVar24 = (this->m_actuations_2)._M_elems[2]._M_elems[5];
          dVar25 = (this->m_actuations_2)._M_elems[2]._M_elems[6];
          dVar26 = (this->m_actuations_2)._M_elems[2]._M_elems[7];
          dVar27 = (this->m_actuations_2)._M_elems[3]._M_elems[1];
          dVar28 = (this->m_actuations_2)._M_elems[3]._M_elems[2];
          dVar29 = (this->m_actuations_2)._M_elems[3]._M_elems[3];
          dVar30 = (this->m_actuations_2)._M_elems[3]._M_elems[4];
          dVar31 = (this->m_actuations_2)._M_elems[3]._M_elems[5];
          dVar32 = (this->m_actuations_2)._M_elems[3]._M_elems[6];
          dVar33 = (this->m_actuations_2)._M_elems[3]._M_elems[7];
          (this->m_actuations_1)._M_elems[3]._M_elems[0] =
               (this->m_actuations_2)._M_elems[3]._M_elems[0];
          (this->m_actuations_1)._M_elems[3]._M_elems[1] = dVar27;
          (this->m_actuations_1)._M_elems[3]._M_elems[2] = dVar28;
          (this->m_actuations_1)._M_elems[3]._M_elems[3] = dVar29;
          (this->m_actuations_1)._M_elems[3]._M_elems[4] = dVar30;
          (this->m_actuations_1)._M_elems[3]._M_elems[5] = dVar31;
          (this->m_actuations_1)._M_elems[3]._M_elems[6] = dVar32;
          (this->m_actuations_1)._M_elems[3]._M_elems[7] = dVar33;
          (this->m_actuations_1)._M_elems[2]._M_elems[0] = dVar19;
          (this->m_actuations_1)._M_elems[2]._M_elems[1] = dVar20;
          (this->m_actuations_1)._M_elems[2]._M_elems[2] = dVar21;
          (this->m_actuations_1)._M_elems[2]._M_elems[3] = dVar22;
          (this->m_actuations_1)._M_elems[2]._M_elems[4] = dVar23;
          (this->m_actuations_1)._M_elems[2]._M_elems[5] = dVar24;
          (this->m_actuations_1)._M_elems[2]._M_elems[6] = dVar25;
          (this->m_actuations_1)._M_elems[2]._M_elems[7] = dVar26;
          (this->m_actuations_1)._M_elems[1]._M_elems[0] = dVar11;
          (this->m_actuations_1)._M_elems[1]._M_elems[1] = dVar12;
          (this->m_actuations_1)._M_elems[1]._M_elems[2] = dVar13;
          (this->m_actuations_1)._M_elems[1]._M_elems[3] = dVar14;
          (this->m_actuations_1)._M_elems[1]._M_elems[4] = dVar15;
          (this->m_actuations_1)._M_elems[1]._M_elems[5] = dVar16;
          (this->m_actuations_1)._M_elems[1]._M_elems[6] = dVar17;
          (this->m_actuations_1)._M_elems[1]._M_elems[7] = dVar18;
          (this->m_actuations_1)._M_elems[0]._M_elems[0] = dVar43;
          (this->m_actuations_1)._M_elems[0]._M_elems[1] = dVar2;
          (this->m_actuations_1)._M_elems[0]._M_elems[2] = dVar5;
          (this->m_actuations_1)._M_elems[0]._M_elems[3] = dVar6;
          (this->m_actuations_1)._M_elems[0]._M_elems[4] = dVar7;
          (this->m_actuations_1)._M_elems[0]._M_elems[5] = dVar8;
          (this->m_actuations_1)._M_elems[0]._M_elems[6] = dVar9;
          (this->m_actuations_1)._M_elems[0]._M_elems[7] = dVar10;
          piVar4 = this->m_ifs;
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 2) != 0) {
            if (this->m_repeat != true) {
              return;
            }
            std::ios::clear((int)piVar4 + (int)*(long *)(*(long *)piVar4 + -0x18));
            std::istream::seekg(this->m_ifs,0,0);
            LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
            LoadDataLine(this,pdVar1,pAVar35);
            this->m_offset = time;
            std::operator<<((ostream *)&std::cout,"time = ");
            poVar36 = std::ostream::_M_insert<double>(time);
            poVar36 = std::operator<<(poVar36," New cycle");
            std::endl<char,std::char_traits<char>>(poVar36);
            pPVar41 = this->m_callback;
            if (pPVar41 == (PhaseChangeCallback *)0x0) {
              return;
            }
            (**(code **)(*(long *)pPVar41 + 0x10))(pPVar41,3);
            return;
          }
          LoadDataLine(this,pdVar1,pAVar35);
        }
      }
      else {
        dVar43 = this->m_time_2;
      }
      dVar2 = this->m_time_1;
      pAVar35 = &this->m_actuations;
      auVar44._0_8_ = (dVar42 - dVar43) / (dVar2 - dVar43);
      auVar44._8_8_ = 0;
      for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
        for (lVar39 = 0; lVar39 != 0x40; lVar39 = lVar39 + 8) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)pAVar35[-2]._M_elems[0]._M_elems + lVar39);
          auVar46._8_8_ = 0;
          auVar46._0_8_ =
               ((dVar42 - dVar2) / (dVar43 - dVar2)) *
               *(double *)((long)pAVar35[-1]._M_elems[0]._M_elems + lVar39);
          auVar3 = vfmadd231sd_fma(auVar46,auVar44,auVar3);
          *(long *)((long)pAVar35->_M_elems[0]._M_elems + lVar39) = auVar3._0_8_;
        }
        pAVar35 = (Actuation *)(pAVar35->_M_elems + 1);
      }
      return;
    }
    auVar45._0_8_ = time / this->m_time_pose;
    auVar45._8_8_ = in_XMM0_Qb;
    auVar44 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar45,ZEXT816(0xc024000000000000));
    local_30 = auVar44._0_8_;
    dVar42 = exp(local_30);
    dVar43 = exp(local_30);
    pAVar35 = &this->m_actuations;
    for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
      for (lVar39 = 0; lVar39 != 0x40; lVar39 = lVar39 + 8) {
        *(double *)((long)pAVar35->_M_elems[0]._M_elems + lVar39) =
             (dVar42 / (dVar43 + 1.0)) *
             *(double *)((long)pAVar35[-2]._M_elems[0]._M_elems + lVar39);
      }
      pAVar35 = (Actuation *)(pAVar35->_M_elems + 1);
    }
    if (time < this->m_time_pose) {
      return;
    }
    this->m_phase = HOLD;
    std::operator<<((ostream *)&std::cout,"time = ");
    poVar36 = std::ostream::_M_insert<double>(time);
    poVar36 = std::operator<<(poVar36,"  Switch to phase: ");
    GetCurrentPhase_abi_cxx11_(&local_50,this);
    poVar36 = std::operator<<(poVar36,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar36);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar41 = this->m_callback;
    if (pPVar41 == (PhaseChangeCallback *)0x0) {
      return;
    }
    PVar38 = this->m_phase;
    lVar37 = *(long *)pPVar41;
    uVar40 = 0;
  }
LAB_0016226c:
  (**(code **)(lVar37 + 0x10))(pPVar41,uVar40,PVar38);
  return;
}

Assistant:

void RS_Driver::Update(double time) {
    bool ext_actuation = false;
    // In the POSE phase, use a logistic function to reach first data entry
    if (m_phase == POSE) {
        ax op;
        double x = 20 * (time / m_time_pose) - 10;
        op.a = std::exp(x) / (1 + std::exp(x));
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations[i].begin(), op);
        }
        if (time >= m_time_pose) {
            m_phase = HOLD;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(POSE, m_phase);
        }
        return;
    }

    // In the HOLD phase, always use the first data entry
    if (m_phase == HOLD) {
        m_actuations = m_actuations_1;
        if (time >= m_offset) {
            m_phase = (m_ifs_start.is_open()) ? START : CYCLE;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(HOLD, m_phase);
        }
        return;
    }

    // Offset time
    double t = time - m_offset;

    switch (m_phase) {
        case START:
            while (t > m_time_2) {
                m_time_1 = m_time_2;
                m_actuations_1 = m_actuations_2;
                if (!m_ifs->eof()) {
                    LoadDataLine(m_time_2, m_actuations_2);
                } else {
                    m_phase = CYCLE;
                    m_ifs = &m_ifs_cycle;
                    LoadDataLine(m_time_1, m_actuations_1);
                    LoadDataLine(m_time_2, m_actuations_2);
                    m_offset = time;
                    std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
                    if (m_callback)
                        m_callback->OnPhaseChange(START, CYCLE);
                    return;
                }
            }

            break;

        case CYCLE:
            if (!driven) {
                while (t > m_time_2) {
                    m_time_1 = m_time_2;
                    m_actuations_1 = m_actuations_2;
                    if (m_ifs->eof()) {
                        if (m_repeat) {
                            m_ifs->clear();
                            m_ifs->seekg(0);
                            LoadDataLine(m_time_1, m_actuations_1);
                            LoadDataLine(m_time_2, m_actuations_2);
                            m_offset = time;
                            std::cout << "time = " << time << " New cycle" << std::endl;
                            if (m_callback)
                                m_callback->OnPhaseChange(CYCLE, CYCLE);
                        }
                        return;
                    }
                    LoadDataLine(m_time_2, m_actuations_2);
                }
            } else {
                ext_actuation = true;
            }

            break;

        case STOP:
            //// TODO
            break;

        default:
            break;
    }

    // Interpolate  v = alpha_1 * v_1 + alpha_2 * v_2
    if (!ext_actuation) {
        axpby op;
        op.a1 = (t - m_time_2) / (m_time_1 - m_time_2);
        op.a2 = (t - m_time_1) / (m_time_2 - m_time_1);
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations_2[i].begin(),
                           m_actuations[i].begin(), op);
        }
    }
}